

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O1

void __thiscall async_reader::run(async_reader *this)

{
  stream_socket *psVar1;
  char *p;
  mutable_buffer tmp;
  callback<void_(const_std::error_code_&,_unsigned_long)> local_48;
  buffer_impl<char_*> local_40;
  
  psVar1 = this->sock;
  p = (this->buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  local_40.size_ = 0;
  local_40.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.vec_.
  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add
            (&local_40,p,
             (long)(this->buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)p);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<async_reader>
            (&local_48,*this);
  booster::aio::stream_socket::async_read_some((mutable_buffer *)psVar1,(callback *)&local_40);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_48.call_ptr);
  if (local_40.vec_.
      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run()
	{
		sock->async_read_some(io::buffer(*buf),*this);
	}